

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_stdio.c
# Opt level: O0

void test_stdio(void)

{
  wchar_t wVar1;
  FILE *__stream;
  undefined4 unaff_retaddr;
  wchar_t unaff_retaddr_00;
  char *in_stack_00000008;
  char *in_stack_00000010;
  void *in_stack_00000018;
  int r;
  size_t s;
  char *p;
  FILE *filelist;
  char *in_stack_00000038;
  size_t in_stack_00000050;
  char *in_stack_00000058;
  void *in_stack_00000060;
  char *in_stack_00000478;
  wchar_t in_stack_00000484;
  char *in_stack_00000488;
  void *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  char *e1;
  char *in_stack_ffffffffffffffd8;
  longlong v1;
  undefined4 in_stack_ffffffffffffffe0;
  wchar_t in_stack_ffffffffffffffe4;
  char *in_stack_ffffffffffffffe8;
  undefined8 in_stack_fffffffffffffff0;
  char *in_stack_fffffffffffffff8;
  
  assertion_umask(in_stack_ffffffffffffffd0,(wchar_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                  (wchar_t)in_stack_ffffffffffffffc8);
  assertion_make_file(in_stack_00000008,unaff_retaddr_00,in_stack_fffffffffffffff8,
                      (wchar_t)((ulong)in_stack_fffffffffffffff0 >> 0x20),
                      (wchar_t)in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  assertion_make_hardlink
            (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0);
  __stream = fopen("filelist","w");
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                   in_stack_ffffffffffffffc8);
  fprintf(__stream,"f\n");
  fprintf(__stream,"l\n");
  fclose(__stream);
  wVar1 = systemf("%s cf archive f l >cf.out 2>cf.err",testprog);
  assertion_equal_int(in_stack_ffffffffffffffe8,wVar1,(longlong)in_stack_ffffffffffffffd8,
                      in_stack_ffffffffffffffd0,0,(char *)0x117690,
                      (void *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  assertion_empty_file(in_stack_00000488,in_stack_00000484,in_stack_00000478);
  assertion_empty_file(in_stack_00000488,in_stack_00000484,in_stack_00000478);
  wVar1 = systemf("%s cvf archive f l >cvf.out 2>cvf.err",testprog);
  assertion_equal_int(in_stack_ffffffffffffffe8,wVar1,(longlong)in_stack_ffffffffffffffd8,
                      in_stack_ffffffffffffffd0,0,(char *)0x11770d,
                      (void *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  failure(
         "\'cv\' writes filenames to stderr, nothing to stdout (SUSv2)\nNote that GNU tar writes the file list to stdout by default."
         );
  assertion_empty_file(in_stack_00000488,in_stack_00000484,in_stack_00000478);
  wVar1 = systemf("%s cvf - f l >cvf-.out 2>cvf-.err",testprog);
  assertion_equal_int(in_stack_ffffffffffffffe8,wVar1,(longlong)in_stack_ffffffffffffffd8,
                      in_stack_ffffffffffffffd0,0,(char *)0x117780,
                      (void *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  failure("cvf - should write archive to stdout");
  failure("cvf - should write file list to stderr (SUSv2)");
  wVar1 = systemf("%s tf archive >tf.out 2>tf.err",testprog);
  assertion_equal_int(in_stack_ffffffffffffffe8,wVar1,(longlong)in_stack_ffffffffffffffd8,
                      in_stack_ffffffffffffffd0,0,(char *)0x1177e9,
                      (void *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  assertion_empty_file(in_stack_00000488,in_stack_00000484,in_stack_00000478);
  failure("\'t\' mode should write results to stdout");
  wVar1 = systemf("%s tvf archive >tvf.out 2>tvf.err",testprog);
  assertion_equal_int(in_stack_ffffffffffffffe8,wVar1,(longlong)in_stack_ffffffffffffffd8,
                      in_stack_ffffffffffffffd0,0,(char *)0x11785c,
                      (void *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  assertion_empty_file(in_stack_00000488,in_stack_00000484,in_stack_00000478);
  failure("\'tv\' mode should write results to stdout");
  wVar1 = systemf("%s tvf - < archive >tvf-.out 2>tvf-.err",testprog);
  assertion_equal_int(in_stack_ffffffffffffffe8,wVar1,(longlong)in_stack_ffffffffffffffd8,
                      in_stack_ffffffffffffffd0,0,(char *)0x1178cf,
                      (void *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  assertion_empty_file(in_stack_00000488,in_stack_00000484,in_stack_00000478);
  wVar1 = systemf("%s xf archive >xf.out 2>xf.err",testprog);
  assertion_equal_int(in_stack_ffffffffffffffe8,wVar1,(longlong)in_stack_ffffffffffffffd8,
                      in_stack_ffffffffffffffd0,0,(char *)0x117934,
                      (void *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  assertion_empty_file(in_stack_00000488,in_stack_00000484,in_stack_00000478);
  assertion_empty_file(in_stack_00000488,in_stack_00000484,in_stack_00000478);
  wVar1 = systemf("%s xvf archive >xvf.out 2>xvf.err",testprog);
  assertion_equal_int(in_stack_ffffffffffffffe8,wVar1,(longlong)in_stack_ffffffffffffffd8,
                      in_stack_ffffffffffffffd0,0,(char *)0x1179b1,
                      (void *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  assertion_empty_file(in_stack_00000488,in_stack_00000484,in_stack_00000478);
  wVar1 = systemf("%s xvOf archive >xvOf.out 2>xvOf.err",testprog);
  assertion_equal_int(in_stack_ffffffffffffffe8,wVar1,(longlong)in_stack_ffffffffffffffd8,
                      in_stack_ffffffffffffffd0,0,(char *)0x117a16,
                      (void *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  slurpfile((size_t *)&stack0xffffffffffffffe8,"xvOf.out");
  assertion_equal_int(in_stack_ffffffffffffffe8,wVar1,(longlong)in_stack_ffffffffffffffd8,
                      in_stack_ffffffffffffffd0,0,(char *)0x117a65,
                      (void *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  e1 = "3";
  v1 = 0;
  assertion_equal_mem(in_stack_00000038,filelist._4_4_,p,(char *)s,in_stack_00000018,
                      in_stack_00000010,in_stack_00000050,in_stack_00000058,in_stack_00000060);
  wVar1 = systemf("%s xvf - < archive >xvf-.out 2>xvf-.err",testprog);
  assertion_equal_int(in_stack_ffffffffffffffe8,wVar1,v1,e1,0,(char *)0x117afd,
                      (void *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  assertion_empty_file(in_stack_00000488,in_stack_00000484,in_stack_00000478);
  return;
}

Assistant:

DEFINE_TEST(test_stdio)
{
	FILE *filelist;
	char *p;
	size_t s;
	int r;

	assertUmask(0);

	/*
	 * Create a couple of files on disk.
	 */
	/* File */
	assertMakeFile("f", 0755, "abc");
	/* Link to above file. */
	assertMakeHardlink("l", "f");

	/* Create file list (text mode here) */
	filelist = fopen("filelist", "w");
	assert(filelist != NULL);
	fprintf(filelist, "f\n");
	fprintf(filelist, "l\n");
	fclose(filelist);

	/*
	 * Archive/dearchive with a variety of options, verifying
	 * stdio paths.
	 */

	/* 'cf' should generate no output unless there's an error. */
	r = systemf("%s cf archive f l >cf.out 2>cf.err", testprog);
	assertEqualInt(r, 0);
	assertEmptyFile("cf.out");
	assertEmptyFile("cf.err");

	/* 'cvf' should generate file list on stderr, empty stdout. */
	r = systemf("%s cvf archive f l >cvf.out 2>cvf.err", testprog);
	assertEqualInt(r, 0);
	failure("'cv' writes filenames to stderr, nothing to stdout (SUSv2)\n"
	    "Note that GNU tar writes the file list to stdout by default.");
	assertEmptyFile("cvf.out");
	/* TODO: Verify cvf.err has file list in SUSv2-prescribed format. */

	/* 'cvf -' should generate file list on stderr, archive on stdout. */
	r = systemf("%s cvf - f l >cvf-.out 2>cvf-.err", testprog);
	assertEqualInt(r, 0);
	failure("cvf - should write archive to stdout");
	/* TODO: Verify cvf-.out has archive. */
	failure("cvf - should write file list to stderr (SUSv2)");
	/* TODO: Verify cvf-.err has verbose file list. */

	/* 'tf' should generate file list on stdout, empty stderr. */
	r = systemf("%s tf archive >tf.out 2>tf.err", testprog);
	assertEqualInt(r, 0);
	assertEmptyFile("tf.err");
	failure("'t' mode should write results to stdout");
	/* TODO: Verify tf.out has file list. */

	/* 'tvf' should generate file list on stdout, empty stderr. */
	r = systemf("%s tvf archive >tvf.out 2>tvf.err", testprog);
	assertEqualInt(r, 0);
	assertEmptyFile("tvf.err");
	failure("'tv' mode should write results to stdout");
	/* TODO: Verify tvf.out has file list. */

	/* 'tvf -' uses stdin, file list on stdout, empty stderr. */
	r = systemf("%s tvf - < archive >tvf-.out 2>tvf-.err", testprog);
	assertEqualInt(r, 0);
	assertEmptyFile("tvf-.err");
	/* TODO: Verify tvf-.out has file list. */

	/* Basic 'xf' should generate no output on stdout or stderr. */
	r = systemf("%s xf archive >xf.out 2>xf.err", testprog);
	assertEqualInt(r, 0);
	assertEmptyFile("xf.err");
	assertEmptyFile("xf.out");

	/* 'xvf' should generate list on stderr, empty stdout. */
	r = systemf("%s xvf archive >xvf.out 2>xvf.err", testprog);
	assertEqualInt(r, 0);
	assertEmptyFile("xvf.out");
	/* TODO: Verify xvf.err */

	/* 'xvOf' should generate list on stderr, file contents on stdout. */
	r = systemf("%s xvOf archive >xvOf.out 2>xvOf.err", testprog);
	assertEqualInt(r, 0);
	/* Verify xvOf.out is the file contents */
	p = slurpfile(&s, "xvOf.out");
	assertEqualInt((int)s, 3);
	assertEqualMem(p, "abc", 3);
	/* TODO: Verify xvf.err */

	/* 'xvf -' should generate list on stderr, empty stdout. */
	r = systemf("%s xvf - < archive >xvf-.out 2>xvf-.err", testprog);
	assertEqualInt(r, 0);
	assertEmptyFile("xvf-.out");
	/* TODO: Verify xvf-.err */
}